

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_array_add_elem(jx9_value *pArray,jx9_value *pKey,jx9_value *pValue)

{
  int rc;
  jx9_value *pValue_local;
  jx9_value *pKey_local;
  jx9_value *pArray_local;
  
  if ((pArray->iFlags & 0x40U) == 0) {
    pArray_local._4_4_ = -0x18;
  }
  else {
    pArray_local._4_4_ = jx9HashmapInsert((jx9_hashmap *)(pArray->x).pOther,pKey,pValue);
  }
  return pArray_local._4_4_;
}

Assistant:

JX9_PRIVATE int jx9_array_add_elem(jx9_value *pArray, jx9_value *pKey, jx9_value *pValue)
{
	int rc;
	/* Make sure we are dealing with a valid hashmap */
	if( (pArray->iFlags & MEMOBJ_HASHMAP) == 0 ){
		return JX9_CORRUPT;
	}
	/* Perform the insertion */
	rc = jx9HashmapInsert((jx9_hashmap *)pArray->x.pOther, &(*pKey), &(*pValue));
	return rc;
}